

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O0

bool gzip::is_compressed(char *data,size_t size)

{
  bool local_1b;
  bool local_1a;
  bool local_19;
  size_t size_local;
  char *data_local;
  
  local_19 = false;
  if (2 < size) {
    if ((*data != 'x') ||
       ((((local_1a = true, data[1] != -100 && (local_1a = true, data[1] != '\x01')) &&
         (local_1a = true, data[1] != -0x26)) && (local_1a = true, data[1] != '^')))) {
      local_1b = false;
      if (*data == '\x1f') {
        local_1b = data[1] == -0x75;
      }
      local_1a = local_1b;
    }
    local_19 = local_1a;
  }
  return local_19;
}

Assistant:

inline bool is_compressed(const char *data, std::size_t size) {
        return size > 2 &&
               (
                       // zlib
                       (
                               static_cast<uint8_t>(data[0]) == 0x78 &&
                               (static_cast<uint8_t>(data[1]) == 0x9C ||
                                static_cast<uint8_t>(data[1]) == 0x01 ||
                                static_cast<uint8_t>(data[1]) == 0xDA ||
                                static_cast<uint8_t>(data[1]) == 0x5E)) ||
                       // gzip
                       (static_cast<uint8_t>(data[0]) == 0x1F && static_cast<uint8_t>(data[1]) == 0x8B));
    }